

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# left_objects_detector.cpp
# Opt level: O0

void __thiscall
feintrack::SimpleLeftObjectsDetector::DelUidFromShadyLeftObjects
          (SimpleLeftObjectsDetector *this,uint obj_uid)

{
  bool bVar1;
  reference pCVar2;
  CShadyLeftObj *obj;
  iterator __end1;
  iterator __begin1;
  list<feintrack::CShadyLeftObj,_std::allocator<feintrack::CShadyLeftObj>_> *__range1;
  uint obj_uid_local;
  SimpleLeftObjectsDetector *this_local;
  
  __end1 = std::__cxx11::list<feintrack::CShadyLeftObj,_std::allocator<feintrack::CShadyLeftObj>_>::
           begin(&this->shady_left_objects);
  obj = (CShadyLeftObj *)
        std::__cxx11::list<feintrack::CShadyLeftObj,_std::allocator<feintrack::CShadyLeftObj>_>::end
                  (&this->shady_left_objects);
  while( true ) {
    bVar1 = std::operator!=(&__end1,(_Self *)&obj);
    if (!bVar1) {
      return;
    }
    pCVar2 = std::_List_iterator<feintrack::CShadyLeftObj>::operator*(&__end1);
    if ((pCVar2->super_CLeftObjView).obj_uid == obj_uid) break;
    std::_List_iterator<feintrack::CShadyLeftObj>::operator++(&__end1);
  }
  (pCVar2->super_CLeftObjView).obj_uid = 0;
  return;
}

Assistant:

void SimpleLeftObjectsDetector::DelUidFromShadyLeftObjects(
        unsigned int obj_uid
        )
{
    for (auto& obj : shady_left_objects)
    {
        if (obj.obj_uid == obj_uid)
        {
            obj.obj_uid = 0;
            return;
        }
    }
}